

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

TestCase *
vkt::tessellation::anon_unknown_2::makeIdentityTessellationShaderCase
          (TestContext *testCtx,TessPrimitiveType primitiveType)

{
  TestCase *this;
  char **value;
  allocator<char> local_a1;
  string local_a0;
  undefined8 local_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = (TestCase *)operator_new(0x78);
  if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    local_80 = *(undefined8 *)(&DAT_00c09428 + (ulong)primitiveType * 8);
  }
  else {
    local_80 = 0;
  }
  de::toString<char_const*>(&local_78,(de *)&local_80,value);
  std::operator+(&local_58,"passthrough_tessellation_geometry_shade_",&local_78);
  std::operator+(&local_38,&local_58,"_no_change");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Passthrough tessellation shader has no effect",&local_a1);
  TestCase::TestCase(this,testCtx,&local_38,&local_a0);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00c093d8;
  *(TessPrimitiveType *)&this[1].super_TestCase.super_TestNode._vptr_TestNode = primitiveType;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return this;
}

Assistant:

inline TestCase* makeIdentityTessellationShaderCase (tcu::TestContext& testCtx, const TessPrimitiveType primitiveType)
{
	return new IdentityTessellationShaderTestCase(
		testCtx,
		"passthrough_tessellation_geometry_shade_" + de::toString(getTessPrimitiveTypeShaderName(primitiveType)) + "_no_change",
		"Passthrough tessellation shader has no effect",
		primitiveType);
}